

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.cc
# Opt level: O2

ostream * std::operator<<(ostream *os,color4h *v)

{
  ostream *poVar1;
  float fVar2;
  
  poVar1 = std::operator<<(os,"(");
  fVar2 = tinyusdz::value::half_to_float((half)(v->r).value);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,fVar2);
  poVar1 = std::operator<<(poVar1,", ");
  fVar2 = tinyusdz::value::half_to_float((half)(v->g).value);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,fVar2);
  poVar1 = std::operator<<(poVar1,", ");
  fVar2 = tinyusdz::value::half_to_float((half)(v->b).value);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,fVar2);
  poVar1 = std::operator<<(poVar1,", ");
  fVar2 = tinyusdz::value::half_to_float((half)(v->a).value);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,fVar2);
  std::operator<<(poVar1,")");
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const tinyusdz::value::color4h &v) {
  os << "(" << tinyusdz::value::half_to_float(v.r) << ", "
     << tinyusdz::value::half_to_float(v.g) << ", "
     << tinyusdz::value::half_to_float(v.b) << ", "
     << tinyusdz::value::half_to_float(v.a) << ")";
  return os;
}